

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

void bam_hdr_destroy(bam_hdr_t *h)

{
  long lVar1;
  
  if (h != (bam_hdr_t *)0x0) {
    if (h->target_name != (char **)0x0) {
      if (0 < h->n_targets) {
        lVar1 = 0;
        do {
          free(h->target_name[lVar1]);
          lVar1 = lVar1 + 1;
        } while (lVar1 < h->n_targets);
      }
      free(h->target_name);
      free(h->target_len);
    }
    free(h->text);
    free(h->cigar_tab);
    if ((kh_s2i_t *)h->sdict != (kh_s2i_t *)0x0) {
      kh_destroy_s2i((kh_s2i_t *)h->sdict);
    }
    free(h);
    return;
  }
  return;
}

Assistant:

void bam_hdr_destroy(bam_hdr_t *h)
{
    int32_t i;
    if (h == NULL) return;
    if (h->target_name) {
        for (i = 0; i < h->n_targets; ++i)
            free(h->target_name[i]);
        free(h->target_name);
        free(h->target_len);
    }
    free(h->text); free(h->cigar_tab);
    if (h->sdict) kh_destroy(s2i, (sdict_t*)h->sdict);
    free(h);
}